

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id)

{
  SPIRType *pSVar1;
  SPIRType *pSVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)type_id;
  uVar4 = (ulong)type_id;
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar4);
  if ((*(int *)&(pSVar1->super_IVariant).field_0xc == 0x20) &&
     (pSVar1->storage == PhysicalStorageBuffer)) {
    while( true ) {
      type_id = (uint32_t)uVar3;
      pSVar2 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar3);
      if ((*(int *)&(pSVar2->super_IVariant).field_0xc == 0x20) &&
         (uVar4 = uVar3, pSVar2->storage == PhysicalStorageBuffer)) break;
      type_id = (pSVar1->parent_type).id;
      uVar3 = (ulong)type_id;
      pSVar1 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar3);
      uVar4 = uVar3;
      if ((*(int *)&(pSVar1->super_IVariant).field_0xc != 0x20) ||
         (pSVar1->storage != PhysicalStorageBuffer)) break;
    }
  }
  pSVar1 = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar4);
  if ((*(int *)&(pSVar1->super_IVariant).field_0xc == 0x20) &&
     (pSVar1->storage == PhysicalStorageBuffer)) {
    return type_id;
  }
  __assert_fail("type_is_bda_block_entry(type_id)",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_cross.cpp"
                ,0x148e,
                "uint32_t spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t) const"
               );
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t type_id) const
{
	auto *type = &compiler.get<SPIRType>(type_id);
	while (compiler.is_physical_pointer(*type) && !type_is_bda_block_entry(type_id))
	{
		type_id = type->parent_type;
		type = &compiler.get<SPIRType>(type_id);
	}

	assert(type_is_bda_block_entry(type_id));
	return type_id;
}